

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectile.cpp
# Opt level: O1

void __thiscall CProjectile::FillInfo(CProjectile *this,CNetObj_Projectile *pProj)

{
  uint uVar1;
  float fVar2;
  
  fVar2 = (this->super_CEntity).m_Pos.field_0.x;
  uVar1 = -(uint)(0.0 < fVar2);
  pProj->m_X = (int)((float)(~uVar1 & 0xbf000000 | uVar1 & 0x3f000000) + fVar2);
  fVar2 = (this->super_CEntity).m_Pos.field_1.y;
  uVar1 = -(uint)(0.0 < fVar2);
  pProj->m_Y = (int)((float)(~uVar1 & 0xbf000000 | uVar1 & 0x3f000000) + fVar2);
  fVar2 = (this->m_Direction).field_0.x * 100.0;
  uVar1 = -(uint)(0.0 < fVar2);
  pProj->m_VelX = (int)((float)(~uVar1 & 0xbf000000 | uVar1 & 0x3f000000) + fVar2);
  fVar2 = (this->m_Direction).field_1.y * 100.0;
  uVar1 = -(uint)(0.0 < fVar2);
  pProj->m_VelY = (int)((float)(~uVar1 & 0xbf000000 | uVar1 & 0x3f000000) + fVar2);
  pProj->m_StartTick = this->m_StartTick;
  pProj->m_Type = this->m_Type;
  return;
}

Assistant:

void CProjectile::FillInfo(CNetObj_Projectile *pProj)
{
	pProj->m_X = round_to_int(m_Pos.x);
	pProj->m_Y = round_to_int(m_Pos.y);
	pProj->m_VelX = round_to_int(m_Direction.x*100.0f);
	pProj->m_VelY = round_to_int(m_Direction.y*100.0f);
	pProj->m_StartTick = m_StartTick;
	pProj->m_Type = m_Type;
}